

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

bool __thiscall
SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Prepend
          (SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *this,
          NoCheckHeapAllocator *allocator,RangeUnit<int> *data)

{
  Type pSVar1;
  
  pSVar1 = (Type)Memory::NoCheckHeapAllocator::Alloc(allocator,0x10);
  *(RangeUnit<int> *)(pSVar1 + 1) = *data;
  pSVar1->next = (this->super_SListNodeBase<Memory::NoCheckHeapAllocator>).next;
  (this->super_SListNodeBase<Memory::NoCheckHeapAllocator>).next = pSVar1;
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return true;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }